

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O3

Offset<reflection::Enum> __thiscall reflection::EnumBuilder::Finish(EnumBuilder *this)

{
  Offset<reflection::Enum> table;
  
  table.o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(this->fbb_,this->start_);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::Enum>(this->fbb_,table,4);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::Enum>(this->fbb_,table,6);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::Enum>(this->fbb_,table,10);
  return (Offset<reflection::Enum>)table.o;
}

Assistant:

::flatbuffers::Offset<Enum> Finish() {
    const auto end = fbb_.EndTable(start_);
    auto o = ::flatbuffers::Offset<Enum>(end);
    fbb_.Required(o, Enum::VT_NAME);
    fbb_.Required(o, Enum::VT_VALUES);
    fbb_.Required(o, Enum::VT_UNDERLYING_TYPE);
    return o;
  }